

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawWallMasked1PalCommand::Execute(DrawWallMasked1PalCommand *this,DrawerThread *thread)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  int pitch_00;
  int iVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uchar *dest_00;
  int iVar8;
  uint8_t pix;
  int pitch;
  int bits;
  uint8_t *dest;
  uint8_t *source;
  int count;
  uint8_t *colormap;
  uint32_t frac;
  uint32_t fracstep;
  DrawerThread *thread_local;
  DrawWallMasked1PalCommand *this_local;
  
  iVar2 = *(int *)&(this->super_PalWall1Command).super_DrawerCommand.field_0xc;
  uVar3 = (this->super_PalWall1Command)._texturefrac;
  puVar6 = (this->super_PalWall1Command)._colormap;
  puVar7 = (this->super_PalWall1Command)._source;
  dest_00 = (this->super_PalWall1Command)._dest;
  iVar4 = (this->super_PalWall1Command)._fracbits;
  pitch_00 = (this->super_PalWall1Command)._pitch;
  source._4_4_ = DrawerThread::count_for_thread
                           (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y,
                            (this->super_PalWall1Command)._count);
  if (0 < source._4_4_) {
    _pitch = DrawerThread::dest_for_thread<unsigned_char>
                       (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y,pitch_00,
                        dest_00);
    iVar8 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y);
    colormap._0_4_ = iVar2 * iVar8 + uVar3;
    iVar8 = thread->num_cores;
    iVar5 = thread->num_cores;
    do {
      bVar1 = puVar7[(uint)colormap >> ((byte)iVar4 & 0x1f)];
      if (bVar1 != 0) {
        *_pitch = puVar6[bVar1];
      }
      colormap._0_4_ = iVar8 * iVar2 + (uint)colormap;
      _pitch = _pitch + iVar5 * pitch_00;
      source._4_4_ = source._4_4_ + -1;
    } while (source._4_4_ != 0);
  }
  return;
}

Assistant:

void DrawWallMasked1PalCommand::Execute(DrawerThread *thread)
	{
		uint32_t fracstep = _iscale;
		uint32_t frac = _texturefrac;
		uint8_t *colormap = _colormap;
		int count = _count;
		const uint8_t *source = _source;
		uint8_t *dest = _dest;
		int bits = _fracbits;
		int pitch = _pitch;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		do
		{
			uint8_t pix = source[frac >> bits];
			if (pix != 0)
			{
				*dest = colormap[pix];
			}
			frac += fracstep;
			dest += pitch;
		} while (--count);
	}